

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_test.cpp
# Opt level: O1

void __thiscall Parallel_DoNothing_Test::TestBody(Parallel_DoNothing_Test *this)

{
  bool bVar1;
  function<void_(pbrt::Bounds2<int>)> *func;
  char *pcVar2;
  atomic<int> counter;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  AssertHelper local_88;
  atomic<int> local_7c;
  undefined1 local_78 [16];
  _Manager_type p_Stack_68;
  code *pcStack_60;
  undefined1 local_58 [16];
  code *pcStack_48;
  code *pcStack_40;
  atomic<int> *local_38;
  undefined8 uStack_30;
  code *pcStack_28;
  code *pcStack_20;
  
  local_38 = &local_7c;
  local_7c.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  local_78._0_8_ = &local_38;
  uStack_30 = 0;
  pcStack_20 = std::
               _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/parallel_test.cpp:34:23)>
               ::_M_invoke;
  pcStack_28 = std::
               _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/parallel_test.cpp:34:23)>
               ::_M_manager;
  local_78._8_8_ = (undefined8 *)0x0;
  pcStack_60 = std::
               _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/parallel.h:166:29)>
               ::_M_invoke;
  p_Stack_68 = std::
               _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/parallel.h:166:29)>
               ::_M_manager;
  pbrt::ParallelFor(0,0,(function<void_(long,_long)> *)local_78);
  if (p_Stack_68 != (_Manager_type)0x0) {
    (*p_Stack_68)((_Any_data *)local_78,(_Any_data *)local_78,__destroy_functor);
  }
  if (pcStack_28 != (code *)0x0) {
    (*pcStack_28)(&local_38,&local_38,3);
  }
  local_90.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_90.ptr_._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<int,std::atomic<int>>
            ((internal *)local_78,"0","counter",(int *)&local_90,&local_7c);
  if (local_78[0] == '\0') {
    testing::Message::Message((Message *)&local_90);
    if ((undefined8 *)local_78._8_8_ == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_78._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/parallel_test.cpp"
               ,0x23,pcVar2);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (local_90.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_90.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_90.ptr_ + 8))();
      }
      local_90.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_78 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  LOCK();
  local_7c.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  UNLOCK();
  local_78._0_8_ = (void *)0x0;
  local_78._8_8_ = (undefined8 *)0x0;
  stack0xffffffffffffffb0 = SUB3224(ZEXT432(0),0);
  local_58._0_8_ = &local_7c;
  pcStack_48 = std::
               _Function_handler<void_(pbrt::Bounds2<int>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/parallel_test.cpp:38:45)>
               ::_M_manager;
  pcStack_40 = std::
               _Function_handler<void_(pbrt::Bounds2<int>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/parallel_test.cpp:38:45)>
               ::_M_invoke;
  pbrt::ParallelFor2D((pbrt *)local_78,(Bounds2i *)local_58,func);
  if (pcStack_48 != (code *)0x0) {
    (*pcStack_48)(local_58,local_58,3);
  }
  local_90.ptr_ = local_90.ptr_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<int,std::atomic<int>>
            ((internal *)local_78,"0","counter",(int *)&local_90,&local_7c);
  if (local_78[0] == '\0') {
    testing::Message::Message((Message *)&local_90);
    if ((undefined8 *)local_78._8_8_ == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_78._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/parallel_test.cpp"
               ,0x27,pcVar2);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (local_90.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_90.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_90.ptr_ + 8))();
      }
      local_90.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_78 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(Parallel, DoNothing) {
    std::atomic<int> counter{0};
    ParallelFor(0, 0, [&](int64_t) { ++counter; });
    EXPECT_EQ(0, counter);

    counter = 0;
    ParallelFor2D(Bounds2i{{0, 0}, {0, 0}}, [&](Bounds2i b) { ++counter; });
    EXPECT_EQ(0, counter);
}